

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall node::BlockManager::WriteBlockIndexDB(BlockManager *this)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  int nLastFile;
  _Self __tmp_1;
  const_iterator __position;
  _Self __tmp;
  const_iterator __position_00;
  long in_FS_OFFSET;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vBlocks;
  vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
  vFiles;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  _Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> local_88;
  _Vector_base<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
  local_68;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
  ::reserve((vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
             *)&local_68,(this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __position_00._M_node =
       (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position_00._M_node !=
         &(this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header) {
    local_88._M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->m_blockfile_info).
                   super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)__position_00._M_node[1]._M_color);
    std::
    vector<std::pair<int,CBlockFileInfo_const*>,std::allocator<std::pair<int,CBlockFileInfo_const*>>>
    ::emplace_back<int_const&,CBlockFileInfo*>
              ((vector<std::pair<int,CBlockFileInfo_const*>,std::allocator<std::pair<int,CBlockFileInfo_const*>>>
                *)&local_68,(int *)(__position_00._M_node + 1),(CBlockFileInfo **)&local_88);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->m_dirty_fileinfo,__position_00);
    __position_00._M_node = p_Var3;
  }
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::reserve
            ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)&local_88,
             (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __position._M_node =
       (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node !=
         &(this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header) {
    std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
              ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)&local_88,
               (value_type *)(__position._M_node + 1));
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    std::
    _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
    ::erase_abi_cxx11_((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                        *)&this->m_dirty_blockindex,__position);
    __position._M_node = p_Var3;
  }
  nLastFile = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,&this->cs_LastBlockFile,
             "cs_LastBlockFile",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x1eb,false);
  iVar2 = 0;
  if ((this->m_blockfile_cursors)._M_elems[0].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
    iVar2 = (this->m_blockfile_cursors)._M_elems[0].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
  }
  if ((this->m_blockfile_cursors)._M_elems[1].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
    nLastFile = (this->m_blockfile_cursors)._M_elems[1].
                super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
  }
  if (nLastFile < iVar2) {
    nLastFile = iVar2;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  bVar1 = kernel::BlockTreeDB::WriteBatchSync
                    ((this->m_block_tree_db)._M_t.
                     super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                     .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,
                     (vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
                      *)&local_68,nLastFile,
                     (vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)&local_88)
  ;
  std::_Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~_Vector_base
            (&local_88);
  std::
  _Vector_base<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
  ::~_Vector_base(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteBlockIndexDB()
{
    AssertLockHeld(::cs_main);
    std::vector<std::pair<int, const CBlockFileInfo*>> vFiles;
    vFiles.reserve(m_dirty_fileinfo.size());
    for (std::set<int>::iterator it = m_dirty_fileinfo.begin(); it != m_dirty_fileinfo.end();) {
        vFiles.emplace_back(*it, &m_blockfile_info[*it]);
        m_dirty_fileinfo.erase(it++);
    }
    std::vector<const CBlockIndex*> vBlocks;
    vBlocks.reserve(m_dirty_blockindex.size());
    for (std::set<CBlockIndex*>::iterator it = m_dirty_blockindex.begin(); it != m_dirty_blockindex.end();) {
        vBlocks.push_back(*it);
        m_dirty_blockindex.erase(it++);
    }
    int max_blockfile = WITH_LOCK(cs_LastBlockFile, return this->MaxBlockfileNum());
    if (!m_block_tree_db->WriteBatchSync(vFiles, max_blockfile, vBlocks)) {
        return false;
    }
    return true;
}